

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathLangFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  byte *pbVar1;
  xmlXPathObjectPtr pxVar2;
  xmlChar *pxVar3;
  __int32_t **pp_Var4;
  long lVar5;
  byte bVar6;
  int error;
  uint val;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueFrame < ctxt->valueNr) {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_STRING)) {
        pxVar2 = valuePop(ctxt);
        pbVar1 = pxVar2->stringval;
        pxVar3 = xmlNodeGetLang(ctxt->context->node);
        val = 0;
        if (pbVar1 != (byte *)0x0 && pxVar3 != (xmlChar *)0x0) {
          bVar6 = *pbVar1;
          if (bVar6 == 0) {
            lVar5 = 0;
          }
          else {
            pp_Var4 = __ctype_toupper_loc();
            val = 0;
            lVar5 = 0;
            do {
              if ((*pp_Var4)[bVar6] != (*pp_Var4)[pxVar3[lVar5]]) goto LAB_001dfae3;
              bVar6 = pbVar1[lVar5 + 1];
              lVar5 = lVar5 + 1;
            } while (bVar6 != 0);
          }
          val = (uint)(pxVar3[lVar5] == '-' || pxVar3[lVar5] == '\0');
        }
LAB_001dfae3:
        if (pxVar3 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar3);
        }
        xmlXPathReleaseObject(ctxt->context,pxVar2);
        pxVar2 = xmlXPathCacheNewBoolean(ctxt->context,val);
        valuePush(ctxt,pxVar2);
        return;
      }
      error = 0xb;
    }
    else {
      error = 0x17;
    }
  }
  else {
    error = 0xc;
  }
  xmlXPathErr(ctxt,error);
  return;
}

Assistant:

void
xmlXPathLangFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr val = NULL;
    const xmlChar *theLang = NULL;
    const xmlChar *lang;
    int ret = 0;
    int i;

    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    val = valuePop(ctxt);
    lang = val->stringval;
    theLang = xmlNodeGetLang(ctxt->context->node);
    if ((theLang != NULL) && (lang != NULL)) {
        for (i = 0;lang[i] != 0;i++)
	    if (toupper(lang[i]) != toupper(theLang[i]))
	        goto not_equal;
	if ((theLang[i] == 0) || (theLang[i] == '-'))
	    ret = 1;
    }
not_equal:
    if (theLang != NULL)
	xmlFree((void *)theLang);

    xmlXPathReleaseObject(ctxt->context, val);
    valuePush(ctxt, xmlXPathCacheNewBoolean(ctxt->context, ret));
}